

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Writer * __thiscall el::base::Writer::construct(Writer *this,int count,char *loggerIds,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  Storage *in_RDX;
  int in_ESI;
  Writer *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int i;
  char *id;
  va_list loggersList;
  undefined4 in_stack_fffffffffffffe58;
  LoggingFlag in_stack_fffffffffffffe5c;
  Storage *in_stack_fffffffffffffe60;
  undefined8 *local_190;
  size_type in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  undefined8 local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [30];
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar2;
  Writer *in_stack_ffffffffffffffc0;
  uint local_38;
  undefined8 *local_30;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_158[3] = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x233b7a);
  bVar1 = Storage::hasFlag(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  if (bVar1) {
    local_30 = (undefined8 *)&stack0x00000008;
    local_38 = 0x18;
    utils::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,(char *)in_RDX,&local_69);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe60,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (local_38 < 0x29) {
        local_190 = (undefined8 *)((long)local_158 + (long)(int)local_38);
        local_38 = local_38 + 8;
      }
      else {
        local_190 = local_30;
        local_30 = local_30 + 1;
      }
      in_RDX = (Storage *)*local_190;
    }
    utils::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe60,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
    ;
    initializeLogger((Writer *)in_RDX,(string *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),
                     (bool)in_stack_ffffffffffffffb7,(bool)in_stack_ffffffffffffffb6);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,(char *)in_RDX,&local_a1);
    initializeLogger(in_stack_ffffffffffffffc0,
                     (string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (bool)in_stack_ffffffffffffffb7,(bool)in_stack_ffffffffffffffb6);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    in_stack_fffffffffffffe60 = in_RDX;
  }
  MessageBuilder::initialize
            ((MessageBuilder *)in_stack_fffffffffffffe60,
             (Logger *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  return in_RDI;
}

Assistant:

Writer& Writer::construct(int count, const char* loggerIds, ...) {
  if (ELPP->hasFlag(LoggingFlag::MultiLoggerSupport)) {
    va_list loggersList;
    va_start(loggersList, loggerIds);
    const char* id = loggerIds;
    m_loggerIds.reserve(count);
    for (int i = 0; i < count; ++i) {
      m_loggerIds.push_back(std::string(id));
      id = va_arg(loggersList, const char*);
    }
    va_end(loggersList);
    initializeLogger(m_loggerIds.at(0));
  } else {
    initializeLogger(std::string(loggerIds));
  }
  m_messageBuilder.initialize(m_logger);
  return *this;
}